

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderError11::getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError11 *this,uint n_program_object)

{
  allocator<char> local_1d;
  uint local_1c;
  TessellationShaderError11 *pTStack_18;
  uint n_program_object_local;
  TessellationShaderError11 *this_local;
  
  local_1c = n_program_object;
  pTStack_18 = this;
  this_local = (TessellationShaderError11 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
             ,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError11::getTessellationEvaluationShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_Position = gl_in[0].gl_Position;\n"
		   "}\n";
}